

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void __thiscall llvm::APInt::initFromArray(APInt *this,ArrayRef<unsigned_long> bigVal)

{
  uint uVar1;
  uint uVar2;
  uint64_t *__s;
  anon_union_8_2_1313ab2f_for_U *__src;
  
  __src = (anon_union_8_2_1313ab2f_for_U *)bigVal.Data;
  uVar1 = this->BitWidth;
  if ((ulong)uVar1 == 0) {
    __assert_fail("BitWidth && \"Bitwidth too small\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x5b,"void llvm::APInt::initFromArray(ArrayRef<uint64_t>)");
  }
  if (__src != (anon_union_8_2_1313ab2f_for_U *)0x0) {
    if (uVar1 < 0x41) {
      if (bigVal.Length == 0) {
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/ArrayRef.h"
                      ,0xf1,
                      "const T &llvm::ArrayRef<unsigned long>::operator[](size_t) const [T = unsigned long]"
                     );
      }
      this->U = *__src;
    }
    else {
      uVar1 = (uint)((ulong)uVar1 + 0x3f >> 6);
      __s = (uint64_t *)operator_new__((ulong)(uVar1 * 8));
      memset(__s,0,(ulong)(uVar1 * 8));
      (this->U).pVal = __s;
      uVar2 = (uint)bigVal.Length;
      if (uVar1 < (uint)bigVal.Length) {
        uVar2 = uVar1;
      }
      memcpy(__s,__src,(ulong)(uVar2 << 3));
    }
    clearUnusedBits(this);
    return;
  }
  __assert_fail("bigVal.data() && \"Null pointer detected!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x5c,"void llvm::APInt::initFromArray(ArrayRef<uint64_t>)");
}

Assistant:

void APInt::initFromArray(ArrayRef<uint64_t> bigVal) {
  assert(BitWidth && "Bitwidth too small");
  assert(bigVal.data() && "Null pointer detected!");
  if (isSingleWord())
    U.VAL = bigVal[0];
  else {
    // Get memory, cleared to 0
    U.pVal = getClearedMemory(getNumWords());
    // Calculate the number of words to copy
    unsigned words = std::min<unsigned>(bigVal.size(), getNumWords());
    // Copy the words from bigVal to pVal
    memcpy(U.pVal, bigVal.data(), words * APINT_WORD_SIZE);
  }
  // Make sure unused high bits are cleared
  clearUnusedBits();
}